

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSETBREAKPOINT(void)

{
  int iVar1;
  aint local_c [2];
  aint val;
  
  if (pass == 3) {
    local_c[0] = 0;
    iVar1 = SkipBlanks(&lp);
    if (iVar1 == 0) {
      iVar1 = ParseExpressionNoSyntaxError(&lp,local_c);
      if (iVar1 == 0) {
        Error("[SETBREAKPOINT] Syntax error",bp,SUPPRESS);
      }
      else {
        WriteBreakpoint(local_c[0]);
      }
    }
    else {
      WriteBreakpoint(CurAddress);
    }
  }
  else {
    SkipToEol(&lp);
  }
  return;
}

Assistant:

static void dirSETBREAKPOINT() {
	if (LASTPASS != pass) {
		SkipToEol(lp);
		return;
	}
	aint val = 0;
	if (SkipBlanks(lp)) {		// without any expression do the "$" breakpoint
		WriteBreakpoint(CurAddress);
	} else if (ParseExpressionNoSyntaxError(lp, val)) {
		WriteBreakpoint(val);
	} else {
		Error("[SETBREAKPOINT] Syntax error", bp, SUPPRESS);
	}
}